

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvlTree.cpp
# Opt level: O0

Node * __thiscall AvlTree::findMax(AvlTree *this,Node *node)

{
  Node *node_local;
  AvlTree *this_local;
  
  if (node == (Node *)0x0) {
    this_local = (AvlTree *)0x0;
  }
  else {
    this_local = (AvlTree *)node;
    if (node->rightChild != (Node *)0x0) {
      this_local = (AvlTree *)findMax(this,node->rightChild);
    }
  }
  return (Node *)this_local;
}

Assistant:

AvlTree::Node *AvlTree::findMax(Node *node) {
    if (node == nullptr) {
        return nullptr;
    } else if (node->rightChild == nullptr) {
        return node;
    } else {
        return findMax(node->rightChild);
    }
}